

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

Value * __thiscall
GlobOptBlockData::FindObjectTypeValueNoLivenessCheck(GlobOptBlockData *this,SymID typeSymId)

{
  code *pcVar1;
  bool bVar2;
  Value *pVVar3;
  undefined4 *puVar4;
  
  pVVar3 = FindValueFromMapDirect(this,typeSymId);
  if (pVVar3 != (Value *)0x0) {
    bVar2 = ValueInfo::IsJsType(pVVar3->valueInfo);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x53d,"(value == nullptr || value->GetValueInfo()->IsJsType())",
                         "value == nullptr || value->GetValueInfo()->IsJsType()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return pVVar3;
}

Assistant:

Value *
GlobOptBlockData::FindObjectTypeValueNoLivenessCheck(SymID typeSymId)
{
    Value* value = this->FindValueFromMapDirect(typeSymId);
    Assert(value == nullptr || value->GetValueInfo()->IsJsType());
    return value;
}